

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_source_panner.cpp
# Opt level: O0

Facet * ear::_adjacent_verts
                  (Facet *__return_storage_ptr__,
                  vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                  *facets,int vert)

{
  bool bVar1;
  iterator __first;
  iterator __last;
  _Self local_70 [3];
  _Base_ptr local_58;
  _Rb_tree_const_iterator<int> local_50;
  _Self local_48;
  set<int,_std::less<int>,_std::allocator<int>_> *local_40;
  set<int,_std::less<int>,_std::allocator<int>_> *facetVerts;
  iterator __end1;
  iterator __begin1;
  vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
  *__range1;
  vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
  *pvStack_18;
  int vert_local;
  vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
  *facets_local;
  set<int,_std::less<int>,_std::allocator<int>_> *ret;
  
  __range1._3_1_ = 0;
  __range1._4_4_ = vert;
  pvStack_18 = facets;
  facets_local = (vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                  *)__return_storage_ptr__;
  std::set<int,_std::less<int>,_std::allocator<int>_>::set(__return_storage_ptr__);
  __end1 = std::
           vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
           ::begin(facets);
  facetVerts = (set<int,_std::less<int>,_std::allocator<int>_> *)
               std::
               vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
               ::end(facets);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::set<int,_std::less<int>,_std::allocator<int>_>_*,_std::vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                                     *)&facetVerts), bVar1) {
    local_40 = __gnu_cxx::
               __normal_iterator<std::set<int,_std::less<int>,_std::allocator<int>_>_*,_std::vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
               ::operator*(&__end1);
    local_50._M_node =
         (_Base_ptr)std::set<int,_std::less<int>,_std::allocator<int>_>::begin(local_40);
    local_58 = (_Base_ptr)std::set<int,_std::less<int>,_std::allocator<int>_>::end(local_40);
    local_48._M_node =
         (_Base_ptr)
         std::find<std::_Rb_tree_const_iterator<int>,int>
                   (local_50,(_Rb_tree_const_iterator<int>)local_58,(int *)((long)&__range1 + 4));
    local_70[0]._M_node =
         (_Base_ptr)std::set<int,_std::less<int>,_std::allocator<int>_>::end(local_40);
    bVar1 = std::operator!=(&local_48,local_70);
    if (bVar1) {
      __first = std::set<int,_std::less<int>,_std::allocator<int>_>::begin(local_40);
      __last = std::set<int,_std::less<int>,_std::allocator<int>_>::end(local_40);
      std::set<int,std::less<int>,std::allocator<int>>::insert<std::_Rb_tree_const_iterator<int>>
                ((set<int,std::less<int>,std::allocator<int>> *)__return_storage_ptr__,
                 (_Rb_tree_const_iterator<int>)__first._M_node,
                 (_Rb_tree_const_iterator<int>)__last._M_node);
    }
    __gnu_cxx::
    __normal_iterator<std::set<int,_std::less<int>,_std::allocator<int>_>_*,_std::vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
    ::operator++(&__end1);
  }
  std::set<int,_std::less<int>,_std::allocator<int>_>::erase
            (__return_storage_ptr__,(key_type *)((long)&__range1 + 4));
  return __return_storage_ptr__;
}

Assistant:

Facet _adjacent_verts(std::vector<Facet> facets, int vert) {
    std::set<int> ret;
    for (const auto& facetVerts : facets) {
      if (std::find(facetVerts.begin(), facetVerts.end(), vert) !=
          facetVerts.end()) {
        ret.insert(facetVerts.begin(), facetVerts.end());
      }
    }
    ret.erase(vert);
    return ret;
  }